

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

string * __thiscall
cmState::GetSafeCacheEntryValue(string *__return_storage_ptr__,cmState *this,string *key)

{
  bool bVar1;
  string *psVar2;
  cmValue local_28;
  cmValue val;
  string *key_local;
  cmState *this_local;
  
  val.Value = key;
  local_28 = GetCacheEntryValue(this,key);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::GetSafeCacheEntryValue(std::string const& key) const
{
  if (cmValue val = this->GetCacheEntryValue(key)) {
    return *val;
  }
  return std::string();
}